

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  ~Config(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Config() {
        }